

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O1

void wiz_create_item_subdisplay
               (menu_conflict *m,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  artifact *paVar1;
  void *pvVar2;
  object_kind *k;
  long lVar3;
  char *fmt;
  object *known_obj;
  char buf [70];
  char name [70];
  object *local_d0;
  char local_c8 [80];
  object *local_78 [10];
  
  pvVar2 = menu_priv(m);
  paVar1 = a_info;
  lVar3 = (long)*(int *)((long)pvVar2 + (long)oid * 4);
  if (lVar3 == -9999) {
    object_base_name((char *)local_78,0x46,*(wchar_t *)((long)pvVar2 + (long)oid * 4 + 4),true);
    fmt = "All %s";
    if (choose_artifact != false) {
      fmt = "All artifact %s";
    }
    strnfmt(local_c8,0x46,fmt,local_78);
  }
  else if (choose_artifact == true) {
    local_78[0] = object_new();
    k = lookup_kind(paVar1[lVar3].tval,paVar1[lVar3].sval);
    if (k != (object_kind *)0x0) {
      object_prep(local_78[0],k,L'\0',RANDOMISE);
      local_78[0]->artifact = paVar1 + lVar3;
      local_d0 = object_new();
      local_78[0]->known = local_d0;
      object_copy(local_d0,local_78[0]);
      local_d0->notice = local_d0->notice | 8;
      object_desc(local_c8,0x46,local_78[0],0x30,(player *)0x0);
      object_delete((chunk *)0x0,(chunk *)0x0,&local_d0);
      local_78[0]->known = (object *)0x0;
      object_delete((chunk *)0x0,(chunk *)0x0,local_78);
    }
  }
  else {
    object_kind_name(local_c8,0x46,k_info + lVar3,true);
  }
  c_prt(curs_attrs[1][cursor],local_c8,row,col);
  return;
}

Assistant:

static void wiz_create_item_subdisplay(struct menu *m, int oid, bool cursor,
	int row, int col, int width)
{
	int *choices = menu_priv(m);
	int selected = choices[oid];
	char buf[70];

	if (selected == WIZ_CREATE_ALL_MENU_ITEM) {
		/*
		 * Super big hack: the special flag should be the last menu
		 * item, with the selected tval stored in the next element.
		 */
		int current_tval = choices[oid + 1];
		char name[70];

		object_base_name(name, sizeof(name), current_tval, true);
		if (choose_artifact) {
			strnfmt(buf, sizeof(buf), "All artifact %s", name);
		} else {
			strnfmt(buf, sizeof(buf), "All %s", name);
		}
	} else {
		if (choose_artifact) {
			get_art_name(buf, sizeof(buf), selected);
		} else {
			object_kind_name(buf, sizeof(buf), &k_info[selected],
				true);
		}
	}

	c_prt(curs_attrs[CURS_KNOWN][0 != cursor], buf, row, col);
}